

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O2

float trng::math::detail::inv_GammaP<float>(float a,float p)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float in_XMM0_Db;
  uint extraout_XMM0_Db;
  float fVar8;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar9;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  uint in_XMM1_Db;
  float __x;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  float fVar13;
  uint uVar14;
  float fVar16;
  undefined1 auVar15 [16];
  undefined1 auVar11 [16];
  
  __x = a + -1.0;
  fVar4 = lgammaf(a);
  fVar5 = logf(__x);
  fVar6 = expf((fVar5 + -1.0) * __x - fVar4);
  if (a <= 1.0) {
    fVar7 = 1.0 - (a * 0.12 + 0.253) * a;
    if (fVar7 <= p) {
      fVar7 = log1pf(-(p - fVar7) / (1.0 - fVar7));
      uVar3 = 0;
      fVar7 = 1.0 - fVar7;
    }
    else {
      fVar7 = powf(p / fVar7,1.0 / a);
      uVar3 = extraout_XMM0_Db;
    }
  }
  else {
    uVar3 = -(uint)(p < 0.5);
    fVar7 = logf((float)(~uVar3 & (uint)(1.0 - p) | uVar3 & (uint)p));
    fVar7 = fVar7 * -2.0;
    if (fVar7 < 0.0) {
      fVar7 = sqrtf(fVar7);
    }
    else {
      fVar7 = SQRT(fVar7);
    }
    fVar13 = (fVar7 * 0.04481 + 0.99229) * fVar7 + 1.0;
    fVar7 = (fVar7 * 0.27061 + 2.30753) / fVar13 - fVar7;
    fVar8 = (float)(~in_XMM1_Db & (uint)fVar13);
    uVar14 = (uint)-fVar13 & in_XMM1_Db | (uint)fVar8;
    if (a < 0.0) {
      fVar13 = sqrtf(a);
      fVar8 = extraout_XMM0_Db_00;
    }
    else {
      fVar13 = SQRT(a);
    }
    auVar11._0_8_ = (undefined8)DAT_00261350;
    auVar11._8_4_ = DAT_00261350._4_4_;
    auVar11._12_4_ = uVar14;
    auVar10._8_8_ = auVar11._8_8_;
    auVar10._0_4_ = (undefined4)DAT_00261350;
    auVar10._4_4_ = (uint)-fVar7 & uVar3 | ~uVar3 & (uint)fVar7;
    auVar12._4_4_ = fVar13 * 3.0;
    auVar12._0_4_ = a * 9.0;
    auVar12._8_4_ = in_XMM0_Db * 0.0;
    auVar12._12_4_ = fVar8 * 0.0;
    auVar12 = divps(auVar10,auVar12);
    fVar8 = powf((1.0 - auVar12._0_4_) - auVar12._4_4_,3.0);
    uVar3 = 0;
    fVar7 = 0.001;
    if (0.001 <= fVar8 * a) {
      fVar7 = fVar8 * a;
    }
  }
  iVar2 = 0x19;
  while( true ) {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      return fVar7;
    }
    if (fVar7 <= 0.0) break;
    fVar8 = GammaP<float,true>(a,fVar7);
    if (a <= 1.0) {
      fVar13 = logf(fVar7);
      fVar13 = expf((fVar13 * __x - fVar7) - fVar4);
      uVar9 = extraout_XMM0_Db_02;
    }
    else {
      fVar13 = logf(fVar7);
      fVar13 = expf((fVar13 - fVar5) * __x - (fVar7 - __x));
      fVar13 = fVar13 * fVar6;
      uVar9 = extraout_XMM0_Db_01;
    }
    auVar15._4_4_ = fVar8 - p;
    auVar15._0_4_ = __x;
    auVar15._8_4_ = in_XMM0_Dc;
    auVar15._12_4_ = in_XMM0_Dd;
    auVar1._4_4_ = fVar13;
    auVar1._0_4_ = fVar7;
    auVar1._8_4_ = uVar3;
    auVar1._12_4_ = uVar9;
    auVar12 = divps(auVar15,auVar1);
    fVar16 = auVar12._4_4_;
    fVar13 = (auVar12._0_4_ + -1.0) * fVar16;
    fVar8 = 1.0;
    if (fVar13 <= 1.0) {
      fVar8 = fVar13;
    }
    fVar8 = fVar16 / (1.0 - fVar8 * 0.5);
    fVar7 = fVar7 - fVar8;
    fVar7 = (float)((uint)fVar7 & -(uint)(0.0 < fVar7) |
                   ~-(uint)(0.0 < fVar7) & (uint)((fVar8 + fVar7) * 0.5));
    uVar3 = uVar3 | ~uVar3 & (uint)fVar16;
    if (ABS(fVar8) < fVar7 * 0.00034526698) {
      return fVar7;
    }
  }
  return 0.0;
}

Assistant:

TRNG_CUDA_ENABLE T inv_GammaP(T a, T p) {
        const T eps{sqrt(numeric_limits<T>::epsilon())};
        const T a1{a - 1};
        const T glna{ln_Gamma(a)};
        const T lna1{ln(a1)};
        const T afac{exp(a1 * (lna1 - 1) - glna)};
        T x;
        // initial guess
        if (a > T{1}) {
          const T pp{p < T{1} / T{2} ? p : 1 - p};
          const T t{sqrt(-2 * ln(pp))};
          x = (T{2.30753} + t * T{0.27061}) / (1 + t * (T{0.99229} + t * T{0.04481})) - t;
          x = p < T{1} / T{2} ? -x : x;
          x = utility::max(T{1} / T{1000}, a * pow(1 - 1 / (9 * a) - x / (3 * sqrt(a)), T{3}));
        } else {
          const T t{1 - a * (T{0.253} + a * T{0.12})};
          x = p < t ? pow(p / t, 1 / a) : 1 - ln1p(-(p - t) / (1 - t));
        }
        // refinement by Halley's method
        for (int i{0}; i < numeric_limits<T>::digits; ++i) {
          if (x <= 0) {
            x = 0;
            break;
          }
          const T err{GammaP<T, true>(a, x) - p};
          T t;
          if (a > 1)
            t = afac * exp(-(x - a1) + a1 * (ln(x) - lna1));
          else
            t = exp(-x + a1 * ln(x) - glna);
          const T u{err / t};
          t = u / (1 - utility::min(T{1}, u * ((a - 1) / x - 1)) / 2);
          x -= t;
          x = x <= 0 ? (x + t) / 2 : x;
          if (abs(t) < eps * x)
            break;
        }
        return x;
      }